

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

recursive_directory_iterator ghc::filesystem::begin(recursive_directory_iterator *iter)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *in_RDI;
  recursive_directory_iterator rVar2;
  
  *(element_type **)in_RDI =
       (iter->_impl).
       super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  (in_RDI->_dir_iter_stack).c.
  super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Var1._M_pi = (iter->_impl).
                super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  (iter->_impl).
  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (in_RDI->_dir_iter_stack).c.
  super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)_Var1._M_pi;
  (iter->_impl).
  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  rVar2._impl.
  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  rVar2._impl.
  super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (recursive_directory_iterator)
         rVar2._impl.
         super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

GHC_INLINE recursive_directory_iterator begin(recursive_directory_iterator iter) noexcept
{
    return iter;
}